

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>
::fastAccessDx(FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  Fad<double> *pFVar3;
  double dVar4;
  double dVar5;
  
  pFVar3 = (this->left_->fadexpr_).expr_.fadexpr_.expr_;
  dVar1 = (pFVar3->dx_).ptr_to_data[i];
  dVar4 = exp(-pFVar3->val_);
  dVar2 = (this->right_->fadexpr_).expr_.dx_.ptr_to_data[i];
  dVar5 = exp((this->right_->fadexpr_).expr_.val_);
  return dVar5 * dVar2 - dVar4 * dVar1;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i)+right_.fastAccessDx(i);}